

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O2

uint32_t __thiscall cfd::core::Transaction::GetVsize(Transaction *this)

{
  void *pvVar1;
  CfdException *this_00;
  allocator aStack_45;
  int iStack_44;
  size_t sStack_40;
  undefined1 auStack_38 [32];
  
  pvVar1 = (this->super_AbstractTransaction).wally_tx_pointer_;
  if ((*(long *)((long)pvVar1 + 0x10) == 0) && (*(long *)((long)pvVar1 + 0x28) == 0)) {
    return 10;
  }
  sStack_40 = 0;
  iStack_44 = wally_tx_get_vsize((wally_tx *)(this->super_AbstractTransaction).wally_tx_pointer_,
                                 &sStack_40);
  if (iStack_44 == 0) {
    return (uint32_t)sStack_40;
  }
  auStack_38._0_8_ = "cfdcore_transaction_common.cpp";
  auStack_38._8_4_ = 0x248;
  auStack_38._16_8_ = "GetVsize";
  logger::warn<int&>((CfdSourceLocation *)auStack_38,"wally_tx_get_vsize NG[{}].",&iStack_44);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)auStack_38,"transaction vsize calc error.",&aStack_45);
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)auStack_38);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t Transaction::GetVsize() const {
  size_t vsize = 0;
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  // If both input / output are 0, libwally misidentifies as ElementsTransaction
  if ((tx_pointer->num_inputs == 0) && (tx_pointer->num_outputs == 0)) {
    vsize = static_cast<size_t>(kTransactionMinimumSize);
  } else {
    vsize = AbstractTransaction::GetVsize();
  }
  return static_cast<uint32_t>(vsize);
}